

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_file.c
# Opt level: O2

int archive_write_open_FILE(archive *a,FILE *f)

{
  int iVar1;
  undefined8 *client_data;
  
  client_data = (undefined8 *)malloc(8);
  if (client_data != (undefined8 *)0x0) {
    *client_data = f;
    iVar1 = archive_write_open2(a,client_data,file_open,file_write,(undefined1 *)0x0,file_free);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

int
archive_write_open_FILE(struct archive *a, FILE *f)
{
	struct write_FILE_data *mine;

	mine = malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->f = f;
	return (archive_write_open2(a, mine, file_open, file_write,
	    NULL, file_free));
}